

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_z.cpp
# Opt level: O2

void zaxpy(int n,complex<double> ca,complex<double> *cx,int incx,complex<double> *cy,int incy)

{
  int iVar1;
  complex<double> *__y;
  undefined4 in_register_0000003c;
  long lVar2;
  double *pdVar3;
  bool bVar4;
  double dVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar6;
  complex<double> z;
  undefined1 local_40 [8];
  complex<double> ca_local;
  
  z._M_value._4_4_ = in_register_0000003c;
  z._M_value._0_4_ = n;
  z._M_value._8_8_ = ca._M_value._0_8_;
  if (0 < n) {
    iVar1 = ca._M_value._8_4_;
    dVar5 = zabs1(z);
    dVar6 = 0.0;
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      if (incx == 1 && iVar1 == 1) {
        for (lVar2 = 0; (ulong)(uint)n << 4 != lVar2; lVar2 = lVar2 + 0x10) {
          std::operator*((complex<double> *)local_40,(complex<double> *)(z._M_value._8_8_ + lVar2));
          dVar6 = dVar6 + *(double *)(cx->_M_value + lVar2 + 8);
          *(double *)(cx->_M_value + lVar2) =
               extraout_XMM0_Qa_00 + *(double *)(cx->_M_value + lVar2);
          *(double *)(cx->_M_value + lVar2 + 8) = dVar6;
        }
      }
      else {
        __y = (complex<double> *)(z._M_value._8_8_ + (long)(iVar1 >> 0x1f & (1 - n) * iVar1) * 0x10)
        ;
        pdVar3 = (double *)(cx[incx >> 0x1f & (1 - n) * incx]._M_value + 8);
        while (bVar4 = n != 0, n = n + -1, bVar4) {
          std::operator*((complex<double> *)local_40,__y);
          dVar6 = dVar6 + *pdVar3;
          pdVar3[-1] = extraout_XMM0_Qa + pdVar3[-1];
          *pdVar3 = dVar6;
          __y = __y + iVar1;
          pdVar3 = pdVar3 + (long)incx * 2;
        }
      }
    }
  }
  return;
}

Assistant:

void zaxpy ( int n, complex <double> ca, complex <double> cx[],
  int incx, complex <double> cy[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    ZAXPY adds a multiple of one complex <double> vector to another.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of elements in CX and CY.
//
//    Input, complex <double> CA, the multiplier of CX.
//
//    Input, complex <double> CX[], the first vector.
//
//    Input, int INCX, the increment between successive entries of CX.
//
//    Input/output, complex <double> CY[], the second vector.
//    On output, CY(*) has been replaced by CY(*) + CA * CX(*).
//
//    Input, int INCY, the increment between successive entries of CY.
//
{
  int i;
  int ix;
  int iy;

  if ( n <= 0 )
  {
    return;
  }

  if ( zabs1 ( ca ) == 0.0 )
  {
    return;
  }

  if ( incx != 1 || incy != 1 )
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      cy[iy] = cy[iy] + ca * cx[ix];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
  else
  {
    for ( i = 0; i < n; i++ )
    {
      cy[i] = cy[i] + ca * cx[i];
    }

  }

  return;
}